

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall yy::parser::yy_lac_discard_(parser *this,char *event)

{
  ostream *poVar1;
  char *event_local;
  parser *this_local;
  
  if ((this->yy_lac_established_ & 1U) != 0) {
    if (this->yydebug_ != 0) {
      poVar1 = std::operator<<(this->yycdebug_,"LAC: initial context discarded due to ");
      poVar1 = std::operator<<(poVar1,event);
      std::operator<<(poVar1,'\n');
    }
    this->yy_lac_established_ = false;
  }
  return;
}

Assistant:

void
  parser::yy_lac_discard_ (const char* event)
  {
   /* Discard any previous initial lookahead context because of Event,
      which may be a lookahead change or an invalidation of the currently
      established initial context for the current lookahead.

      The most common example of a lookahead change is a shift.  An example
      of both cases is syntax error recovery.  That is, a syntax error
      occurs when the lookahead is syntactically erroneous for the
      currently established initial context, so error recovery manipulates
      the parser stacks to try to find a new initial context in which the
      current lookahead is syntactically acceptable.  If it fails to find
      such a context, it discards the lookahead.  */
    if (yy_lac_established_)
      {
        YYCDEBUG << "LAC: initial context discarded due to "
                 << event << '\n';
        yy_lac_established_ = false;
      }
  }